

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::Arguments::~Arguments(Arguments *this)

{
  long lVar1;
  pointer ppcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (ppcVar2 = (this->args_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar2 !=
      (this->args_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
    free(*ppcVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
              ((_Vector_base<char_*,_std::allocator<char_*>_> *)this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~Arguments() {
    for (std::vector<char*>::iterator i = args_.begin(); i != args_.end();
         ++i) {
      free(*i);
    }
  }